

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zMaster)

{
  int *piVar1;
  BtShared *pBt;
  Pager *pPVar2;
  sqlite3_mutex *psVar3;
  u8 *puVar4;
  int iVar5;
  uint uVar6;
  Pgno nFin;
  undefined8 uVar7;
  BtCursor *pBVar8;
  uint nOrig;
  bool bVar9;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (pBt->autoVacuum != '\0') {
    pPVar2 = pBt->pPager;
    for (pBVar8 = pBt->pCursor; pBVar8 != (BtCursor *)0x0; pBVar8 = pBVar8->pNext) {
      sqlite3_free(pBVar8->aOverflow);
      pBVar8->aOverflow = (Pgno *)0x0;
    }
    if (pBt->incrVacuum == '\0') {
      nOrig = pBt->nPage;
      uVar6 = 0;
      if (1 < nOrig) {
        iVar5 = (nOrig - 2) - (nOrig - 2) % (pBt->usableSize / 5 + 1);
        uVar6 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
      if ((uVar6 == nOrig) || (nOrig == (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
        uVar7 = 0xcdfe;
      }
      else {
        uVar6 = *(uint *)(pBt->pPage1->aData + 0x24);
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        nFin = finalDbSize(pBt,nOrig,uVar6);
        if (nFin <= nOrig) {
          if (nFin < nOrig) {
            iVar5 = saveAllCursors(pBt,0,(BtCursor *)0x0);
            if (iVar5 == 0) {
              do {
                iVar5 = incrVacuumStep(pBt,nFin,nOrig,1);
                nOrig = nOrig - 1;
                bVar9 = iVar5 == 0;
                if (nOrig <= nFin) break;
              } while (iVar5 == 0);
            }
            else {
              bVar9 = false;
            }
          }
          else {
            bVar9 = true;
            iVar5 = 0;
          }
          if ((uVar6 != 0) && (iVar5 == 0x65 || bVar9)) {
            iVar5 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            puVar4 = pBt->pPage1->aData;
            puVar4[0x20] = '\0';
            puVar4[0x21] = '\0';
            puVar4[0x22] = '\0';
            puVar4[0x23] = '\0';
            puVar4 = pBt->pPage1->aData;
            puVar4[0x24] = '\0';
            puVar4[0x25] = '\0';
            puVar4[0x26] = '\0';
            puVar4[0x27] = '\0';
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 nFin >> 0x18 | (nFin & 0xff0000) >> 8 | (nFin & 0xff00) << 8 | nFin << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = nFin;
          }
          if (iVar5 != 0) {
            sqlite3PagerRollback(pPVar2);
            goto LAB_0011f7e1;
          }
          goto LAB_0011f736;
        }
        uVar7 = 0xce03;
      }
      iVar5 = 0xb;
      sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar7,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
      goto LAB_0011f7e1;
    }
  }
LAB_0011f736:
  pPVar2 = pBt->pPager;
  if (pBt->bDoTruncate != '\0') {
    pPVar2->dbSize = pBt->nPage;
  }
  iVar5 = sqlite3PagerCommitPhaseOne(pPVar2,zMaster,0);
LAB_0011f7e1:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar3 = p->pBt->mutex;
      if (psVar3 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      p->locked = '\0';
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zMaster){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(pBt);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zMaster, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}